

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_channel_close(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                  amqp_channel_t channel,int code)

{
  int iVar1;
  amqp_method_number_t replies [2];
  char codestr [13];
  amqp_channel_close_t req;
  amqp_method_number_t local_58 [2];
  char local_4d [13];
  undefined2 local_40 [4];
  long local_38;
  char *local_30;
  undefined4 local_28;
  
  local_58[0] = 0x140029;
  local_58[1] = 0;
  if ((uint)code < 0x10000) {
    local_40[0] = (undefined2)code;
    local_30 = local_4d;
    iVar1 = sprintf(local_30,"%d",(ulong)(uint)code);
    local_38 = (long)iVar1;
    local_28 = 0;
    amqp_simple_rpc(__return_storage_ptr__,state,channel,0x140028,local_58,local_40);
  }
  else {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -10;
  }
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_channel_close(amqp_connection_state_t state,
                                    amqp_channel_t channel, int code) {
  char codestr[13];
  amqp_method_number_t replies[2] = {AMQP_CHANNEL_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  if (code < 0 || code > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }

  req.reply_code = (uint16_t)code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, channel, AMQP_CHANNEL_CLOSE_METHOD, replies,
                         &req);
}